

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celfpp.h
# Opt level: O3

vector<unsigned_long,_std::allocator<unsigned_long>_> *
CELFPP::celfppalgo(vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
                  Graph *graph,double budget,vector<double,_std::allocator<double>_> *budget_list,
                  CascadeModel model)

{
  iterator iVar1;
  ulong uVar2;
  pointer pdVar3;
  pointer puVar4;
  _Elt_pointer ptVar5;
  _Elt_pointer ptVar6;
  _Map_pointer pptVar7;
  _Elt_pointer ptVar8;
  _Elt_pointer ptVar9;
  _Elt_pointer ptVar10;
  _Map_pointer pptVar11;
  ostream *poVar12;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar13;
  undefined8 *puVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  _Head_base<5UL,_double,_false> _Var19;
  _Head_base<2UL,_int,_false> _Var20;
  _Elt_pointer ptVar21;
  double dVar22;
  double dVar23;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar24 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar25 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> vecSeed;
  tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> u;
  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  Q_CB;
  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  Q_UC;
  int local_274;
  _Elt_pointer local_260;
  _Elt_pointer local_258;
  double dStack_250;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_248;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_228;
  unsigned_long *local_208;
  iterator iStack_200;
  unsigned_long *local_1f8;
  _Elt_pointer local_1e8;
  undefined8 uStack_1e0;
  vector<double,_std::allocator<double>_> *local_1d0;
  undefined1 local_1c8 [32];
  _Head_base<1UL,_double,_false> local_1a8;
  _Head_base<0UL,_unsigned_long,_false> _Stack_1a0;
  _Elt_pointer local_198;
  undefined8 uStack_190;
  double local_180;
  _Elt_pointer local_178;
  _Elt_pointer local_170;
  _Elt_pointer local_168;
  _Map_pointer local_160;
  _Elt_pointer local_158;
  double dStack_150;
  _Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  local_148;
  _Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  local_f8;
  _Elt_pointer local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_a0;
  _Elt_pointer local_98;
  _Elt_pointer local_90;
  _Elt_pointer local_88;
  _Map_pointer local_80;
  _Elt_pointer local_78;
  _Elt_pointer local_70;
  _Elt_pointer local_68;
  _Map_pointer local_60;
  _Elt_pointer local_58;
  _Elt_pointer local_50;
  _Elt_pointer local_48;
  _Map_pointer local_40;
  _Elt_pointer local_38;
  
  local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_1d0 = budget_list;
  local_180 = budget;
  local_a0 = __return_storage_ptr__;
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  ::_M_initialize_map(&local_f8,0);
  local_148._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  ::_M_initialize_map(&local_148,0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Initial deque start",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  local_208 = (unsigned_long *)0x0;
  iStack_200._M_current = (unsigned_long *)0x0;
  local_1f8 = (unsigned_long *)0x0;
  local_178 = (_Elt_pointer)0x0;
  if ((graph->
      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (graph->
      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    local_260 = (_Elt_pointer)0x0;
    local_198 = (_Elt_pointer)0x0;
    local_274 = -1;
    _Var20._M_head_impl = -1;
  }
  else {
    _Var20._M_head_impl = -1;
    local_258 = (_Elt_pointer)0x0;
    local_198 = (_Elt_pointer)0x0;
    local_274 = -1;
    do {
      if (iStack_200._M_current == local_1f8) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_208,iStack_200,
                   (unsigned_long *)&local_178);
      }
      else {
        *iStack_200._M_current = (unsigned_long)local_178;
        iStack_200._M_current = iStack_200._M_current + 1;
      }
      local_260 = (_Elt_pointer)
                  GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *
                                            )&local_208,model,10000);
      if (iStack_200._M_current != local_208) {
        uVar18 = 0;
        do {
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          uVar18 = uVar18 + 1;
        } while (uVar18 < (ulong)((long)iStack_200._M_current - (long)local_208 >> 3));
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      ptVar21 = local_260;
      if (_Var20._M_head_impl != -1) {
        local_1c8._0_8_ = SEXT48(_Var20._M_head_impl);
        if (iStack_200._M_current == local_1f8) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_208,iStack_200,
                     (unsigned_long *)local_1c8);
        }
        else {
          *iStack_200._M_current = local_1c8._0_8_;
          iStack_200._M_current = iStack_200._M_current + 1;
        }
        local_1e8 = (_Elt_pointer)
                    GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               *)&local_208,model,10000);
        if (iStack_200._M_current != local_208) {
          uVar18 = 0;
          do {
            poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
            uVar18 = uVar18 + 1;
          } while (uVar18 < (ulong)((long)iStack_200._M_current - (long)local_208 >> 3));
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        iStack_200._M_current = iStack_200._M_current + -1;
        ptVar21 = local_1e8;
      }
      local_1c8._0_8_ =
           (local_1d0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[(long)local_178];
      local_1c8._8_8_ = 0;
      local_1c8._24_4_ = _Var20._M_head_impl;
      _Stack_1a0._M_head_impl = (unsigned_long)local_178;
      local_1c8._16_8_ = ptVar21;
      local_1a8._M_head_impl = (double)local_260;
      std::
      deque<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::allocator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>>>
      ::emplace_back<std::tuple<unsigned_long,double,int,double,unsigned_long,double>>
                ((deque<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::allocator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>>>
                  *)&local_f8,
                 (tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)local_1c8);
      if ((_Var20._M_head_impl == -1) || ((double)local_198 < (double)local_260)) {
        _Var20._M_head_impl = (int)local_178;
        local_198 = local_260;
      }
      local_1c8._0_8_ =
           (local_1d0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[(long)local_178];
      local_260 = (_Elt_pointer)((double)local_260 / (double)local_1c8._0_8_);
      ptVar21 = local_260;
      if (local_274 != -1) {
        _Var19._M_head_impl = (double)(long)local_274;
        local_1c8._0_8_ = _Var19._M_head_impl;
        if (iStack_200._M_current == local_1f8) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_208,iStack_200,
                     (unsigned_long *)local_1c8);
        }
        else {
          *iStack_200._M_current = (unsigned_long)_Var19._M_head_impl;
          iStack_200._M_current = iStack_200._M_current + 1;
        }
        local_1e8 = (_Elt_pointer)
                    GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               *)&local_208,model,10000);
        pdVar3 = (local_1d0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar22 = pdVar3[(long)local_178];
        dVar23 = pdVar3[(long)_Var19._M_head_impl];
        if (iStack_200._M_current != local_208) {
          uVar18 = 0;
          do {
            poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
            uVar18 = uVar18 + 1;
          } while (uVar18 < (ulong)((long)iStack_200._M_current - (long)local_208 >> 3));
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        iStack_200._M_current = iStack_200._M_current + -1;
        local_1c8._0_8_ =
             (local_1d0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[(long)local_178];
        ptVar21 = (_Elt_pointer)((double)local_1e8 / (dVar22 + dVar23));
      }
      local_1c8._8_8_ = (_Elt_pointer)0x0;
      local_1c8._24_4_ = local_274;
      _Stack_1a0._M_head_impl = (unsigned_long)local_178;
      local_1c8._16_8_ = ptVar21;
      local_1a8._M_head_impl = (double)local_260;
      std::
      deque<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::allocator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>>>
      ::emplace_back<std::tuple<unsigned_long,double,int,double,unsigned_long,double>>
                ((deque<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::allocator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>>>
                  *)&local_148,
                 (tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)local_1c8);
      if ((local_274 == -1) || ((double)local_258 < (double)local_260)) {
        local_274 = (int)local_178;
      }
      else {
        local_260 = local_258;
      }
      iStack_200._M_current = iStack_200._M_current + -1;
      local_178 = (_Elt_pointer)
                  ((long)&(local_178->
                          super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                          ).super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
                          super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
                          super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
                          super__Tuple_impl<4UL,_unsigned_long,_double>.
                          super__Tuple_impl<5UL,_double>.super__Head_base<5UL,_double,_false> + 1);
      local_258 = local_260;
    } while (local_178 <
             (_Elt_pointer)
             (((long)(graph->
                     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(graph->
                     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Initial deque end",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  pptVar11 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_node;
  ptVar9 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_last;
  ptVar8 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_first;
  ptVar6 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pptVar7 = local_f8._M_impl.super__Deque_impl_data._M_start._M_node;
  ptVar5 = local_f8._M_impl.super__Deque_impl_data._M_start._M_last;
  ptVar21 = local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (local_f8._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    local_1c8._0_8_ = local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_1e8 = local_f8._M_impl.super__Deque_impl_data._M_start._M_first;
    local_1c8._8_8_ = local_f8._M_impl.super__Deque_impl_data._M_start._M_first;
    local_1c8._16_8_ = local_f8._M_impl.super__Deque_impl_data._M_start._M_last;
    local_1c8._24_8_ = local_f8._M_impl.super__Deque_impl_data._M_start._M_node;
    local_178 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_170 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_168 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_160 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_node;
    uVar18 = ((long)local_f8._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_f8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) *
             -0x5555555555555555 +
             ((long)local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_f8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) *
             -0x5555555555555555 +
             (((long)local_f8._M_impl.super__Deque_impl_data._M_finish._M_node -
               (long)local_f8._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
             (ulong)(local_f8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
             ) * 10;
    lVar15 = 0x3f;
    if (uVar18 != 0) {
      for (; uVar18 >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    std::
    __introsort_loop<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,long,__gnu_cxx::__ops::_Iter_comp_iter<CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_1_>>
              (local_1c8,&local_178,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
    local_78 = ptVar21;
    local_70 = local_1e8;
    local_68 = ptVar5;
    local_60 = pptVar7;
    local_98 = ptVar6;
    local_90 = ptVar8;
    local_88 = ptVar9;
    local_80 = pptVar11;
    std::
    __final_insertion_sort<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,__gnu_cxx::__ops::_Iter_comp_iter<CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_1_>>
              ();
  }
  pptVar11 = local_148._M_impl.super__Deque_impl_data._M_finish._M_node;
  ptVar9 = local_148._M_impl.super__Deque_impl_data._M_finish._M_last;
  ptVar8 = local_148._M_impl.super__Deque_impl_data._M_finish._M_first;
  ptVar6 = local_148._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pptVar7 = local_148._M_impl.super__Deque_impl_data._M_start._M_node;
  ptVar5 = local_148._M_impl.super__Deque_impl_data._M_start._M_last;
  ptVar21 = local_148._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (local_148._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_148._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    local_1c8._0_8_ = local_148._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_1e8 = local_148._M_impl.super__Deque_impl_data._M_start._M_first;
    local_1c8._8_8_ = local_148._M_impl.super__Deque_impl_data._M_start._M_first;
    local_1c8._16_8_ = local_148._M_impl.super__Deque_impl_data._M_start._M_last;
    local_1c8._24_8_ = local_148._M_impl.super__Deque_impl_data._M_start._M_node;
    local_178 = local_148._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_170 = local_148._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_168 = local_148._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_160 = local_148._M_impl.super__Deque_impl_data._M_finish._M_node;
    uVar18 = ((long)local_148._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_148._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) *
             -0x5555555555555555 +
             ((long)local_148._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_148._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) *
             -0x5555555555555555 +
             (((long)local_148._M_impl.super__Deque_impl_data._M_finish._M_node -
               (long)local_148._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
             (ulong)(local_148._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0
                    )) * 10;
    lVar15 = 0x3f;
    if (uVar18 != 0) {
      for (; uVar18 >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    std::
    __introsort_loop<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,long,__gnu_cxx::__ops::_Iter_comp_iter<CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_2_>>
              (local_1c8,&local_178,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
    local_78 = ptVar21;
    local_70 = local_1e8;
    local_68 = ptVar5;
    local_60 = pptVar7;
    local_98 = ptVar6;
    local_90 = ptVar8;
    local_88 = ptVar9;
    local_80 = pptVar11;
    std::
    __final_insertion_sort<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,__gnu_cxx::__ops::_Iter_comp_iter<CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_2_>>
              ();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Start UC",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  iVar16 = -1;
  local_1e8 = (_Elt_pointer)0x0;
  uStack_1e0 = 0;
  if (0.0 < local_180) {
    local_258 = (_Elt_pointer)0x0;
    dStack_250 = 0.0;
    uVar18 = 0;
    local_1e8 = (_Elt_pointer)0x0;
    uStack_1e0 = 0;
    do {
      while ((double)((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
                     super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                     ).super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
                     super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
                     super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
                     super__Tuple_impl<4UL,_unsigned_long,_double>.super__Tuple_impl<5UL,_double>.
                     super__Head_base<5UL,_double,_false> + (double)local_258 <= local_180) {
        if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_f8._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0011beb5;
        local_1c8._0_8_ =
             ((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
             super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
             super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
             super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
             super__Tuple_impl<4UL,_unsigned_long,_double>.super__Tuple_impl<5UL,_double>.
             super__Head_base<5UL,_double,_false>;
        local_1c8._8_8_ =
             ((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
             super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
             super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
             super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
             super__Tuple_impl<4UL,_unsigned_long,_double>.
             super__Head_base<4UL,_unsigned_long,_false>._M_head_impl;
        local_1c8._16_8_ =
             ((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
             super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
             super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
             super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
             super__Head_base<3UL,_double,_false>._M_head_impl;
        local_1c8._24_8_ =
             *(undefined8 *)
              &((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
               super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
               super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
               super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
               super__Head_base<2UL,_int,_false>;
        local_1a8._M_head_impl =
             ((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
             super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
             super__Head_base<1UL,_double,_false>._M_head_impl;
        _Stack_1a0._M_head_impl =
             ((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
             super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
        if ((_Elt_pointer)local_1c8._8_8_ ==
            (_Elt_pointer)
            ((long)local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3)) {
          if (local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_228,
                       (iterator)
                       local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&_Stack_1a0._M_head_impl);
          }
          else {
            *local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = _Stack_1a0._M_head_impl;
            local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          if (local_f8._M_impl.super__Deque_impl_data._M_start._M_cur ==
              local_f8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
            operator_delete(local_f8._M_impl.super__Deque_impl_data._M_start._M_first,0x1e0);
            local_f8._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_f8._M_impl.super__Deque_impl_data._M_start._M_node[1];
            local_f8._M_impl.super__Deque_impl_data._M_start._M_last =
                 local_f8._M_impl.super__Deque_impl_data._M_start._M_cur + 10;
            local_f8._M_impl.super__Deque_impl_data._M_start._M_first =
                 local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_f8._M_impl.super__Deque_impl_data._M_start._M_node =
                 local_f8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          }
          else {
            local_f8._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_f8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
          }
          dVar22 = (double)local_258 + (double)local_1c8._0_8_;
          local_158 = (_Elt_pointer)(dVar22 - 9.223372036854776e+18);
          dStack_150 = dStack_250;
          local_1e8 = (_Elt_pointer)GraphBase::inf_eval(graph,&local_228,model,10000);
          iVar16 = (int)_Stack_1a0._M_head_impl;
          uStack_1e0 = extraout_XMM0_Qb;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"UC push new seed: ",0x12);
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          if ((long)local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start == 0) {
            dVar23 = 0.0;
          }
          else {
            lVar15 = (long)local_228.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_228.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3;
            dVar23 = 0.0;
            lVar17 = 0;
            do {
              dVar23 = dVar23 + (local_1d0->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_start
                                [local_228.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar17]];
              lVar17 = lVar17 + 1;
            } while (lVar15 + (ulong)(lVar15 == 0) != lVar17);
          }
          poVar12 = std::ostream::_M_insert<double>(dVar23);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          poVar12 = std::ostream::_M_insert<double>((double)local_1e8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          uVar18 = (ulong)dVar22;
          uVar18 = (long)(double)local_158 & (long)uVar18 >> 0x3f | uVar18;
        }
        else {
          if (local_1c8._24_4_ == iVar16) {
            ((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
            super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
            super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
            super__Head_base<1UL,_double,_false>._M_head_impl =
                 ((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
                 super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
                 super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
                 super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
                 super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
                 super__Head_base<3UL,_double,_false>._M_head_impl;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"last seed",9);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
            std::ostream::put(-0x28);
            std::ostream::flush();
          }
          else {
            if (local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_228,
                         (iterator)
                         local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&_Stack_1a0._M_head_impl);
            }
            else {
              *local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish = _Stack_1a0._M_head_impl;
              local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            dVar22 = GraphBase::inf_eval(graph,&local_228,model,10000);
            ((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
            super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
            super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
            super__Head_base<1UL,_double,_false>._M_head_impl = dVar22 - (double)local_1e8;
            iVar1._M_current =
                 local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + -1;
            ((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
            super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
            super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
            super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
            super__Head_base<2UL,_int,_false>._M_head_impl = _Var20._M_head_impl;
            local_178 = (_Elt_pointer)(long)_Var20._M_head_impl;
            if (iVar1._M_current ==
                local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar1._M_current;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>(&local_228,iVar1,(unsigned_long *)&local_178);
            }
            else {
              local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1] = (unsigned_long)local_178;
            }
            if (local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_228,
                         (iterator)
                         local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&_Stack_1a0._M_head_impl);
            }
            else {
              *local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish = _Stack_1a0._M_head_impl;
              local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            dVar22 = GraphBase::inf_eval(graph,&local_228,model,10000);
            ((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
            super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
            super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
            super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
            super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
            super__Head_base<3UL,_double,_false>._M_head_impl = dVar22 - (double)local_1e8;
            local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + -2;
          }
          pptVar11 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_node;
          ptVar6 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          pptVar7 = local_f8._M_impl.super__Deque_impl_data._M_start._M_node;
          ptVar5 = local_f8._M_impl.super__Deque_impl_data._M_start._M_last;
          ptVar21 = local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
          if (_Var20._M_head_impl == -1) {
            puVar14 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar14 = "cur_best_UC should not be -1";
            __cxa_throw(puVar14,&char_const*::typeinfo,0);
          }
          if ((double)local_198 <
              ((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
              super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
              super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
              super__Head_base<1UL,_double,_false>._M_head_impl) {
            _Var20._M_head_impl =
                 (int)((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
                      super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                      ).super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
          }
          ((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
          super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
          super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
          super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
          super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
          super__Tuple_impl<4UL,_unsigned_long,_double>.super__Head_base<4UL,_unsigned_long,_false>.
          _M_head_impl = (long)local_228.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_228.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3;
          if (local_f8._M_impl.super__Deque_impl_data._M_start._M_cur !=
              local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur) {
            local_178 = local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_38 = local_f8._M_impl.super__Deque_impl_data._M_start._M_first;
            local_170 = local_f8._M_impl.super__Deque_impl_data._M_start._M_first;
            local_168 = local_f8._M_impl.super__Deque_impl_data._M_start._M_last;
            local_160 = local_f8._M_impl.super__Deque_impl_data._M_start._M_node;
            local_78 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            local_70 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_first;
            local_a8 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_last;
            local_68 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_last;
            local_60 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_node;
            local_158 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_first;
            uVar2 = ((long)local_f8._M_impl.super__Deque_impl_data._M_start._M_last -
                     (long)local_f8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) *
                    -0x5555555555555555 +
                    ((long)local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur -
                     (long)local_f8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) *
                    -0x5555555555555555 +
                    (((long)local_f8._M_impl.super__Deque_impl_data._M_finish._M_node -
                      (long)local_f8._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                    (ulong)(local_f8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                           (_Map_pointer)0x0)) * 10;
            lVar15 = 0x3f;
            if (uVar2 != 0) {
              for (; uVar2 >> lVar15 == 0; lVar15 = lVar15 + -1) {
              }
            }
            std::
            __introsort_loop<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,long,__gnu_cxx::__ops::_Iter_comp_iter<CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_3_>>
                      (&local_178,&local_78,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
            local_98 = ptVar21;
            local_90 = local_38;
            local_88 = ptVar5;
            local_80 = pptVar7;
            local_58 = ptVar6;
            local_50 = local_158;
            local_48 = local_a8;
            local_40 = pptVar11;
            std::
            __final_insertion_sort<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,__gnu_cxx::__ops::_Iter_comp_iter<CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_3_>>
                      (&local_98,&local_58);
          }
        }
        auVar24._8_4_ = (int)(uVar18 >> 0x20);
        auVar24._0_8_ = uVar18;
        auVar24._12_4_ = 0x45300000;
        dStack_250 = auVar24._8_8_ - 1.9342813113834067e+25;
        local_258 = (_Elt_pointer)
                    (dStack_250 + ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0));
        if (local_180 <= (double)local_258) goto LAB_0011beb5;
      }
      if (local_f8._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_f8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_f8._M_impl.super__Deque_impl_data._M_start._M_first,0x1e0);
        local_f8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_f8._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_f8._M_impl.super__Deque_impl_data._M_start._M_last =
             local_f8._M_impl.super__Deque_impl_data._M_start._M_cur + 10;
        local_f8._M_impl.super__Deque_impl_data._M_start._M_first =
             local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_f8._M_impl.super__Deque_impl_data._M_start._M_node =
             local_f8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_f8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_f8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
    } while (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_f8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
LAB_0011beb5:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"End UC",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Start CB",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  local_198 = (_Elt_pointer)0x0;
  uStack_190 = 0;
  if (0.0 < local_180) {
    local_258 = (_Elt_pointer)0x0;
    dStack_250 = 0.0;
    ptVar21 = (_Elt_pointer)0x0;
    local_198 = (_Elt_pointer)0x0;
    uStack_190 = 0;
    do {
      while ((double)((local_148._M_impl.super__Deque_impl_data._M_start._M_cur)->
                     super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                     ).super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
                     super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
                     super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
                     super__Tuple_impl<4UL,_unsigned_long,_double>.super__Tuple_impl<5UL,_double>.
                     super__Head_base<5UL,_double,_false> + (double)local_258 <= local_180) {
        if (local_148._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_148._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0011c5b1;
        local_1c8._0_8_ =
             ((local_148._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
             super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
             super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
             super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
             super__Tuple_impl<4UL,_unsigned_long,_double>.super__Tuple_impl<5UL,_double>.
             super__Head_base<5UL,_double,_false>;
        local_1c8._8_8_ =
             ((local_148._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
             super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
             super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
             super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
             super__Tuple_impl<4UL,_unsigned_long,_double>.
             super__Head_base<4UL,_unsigned_long,_false>._M_head_impl;
        local_1c8._16_8_ =
             ((local_148._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
             super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
             super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
             super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
             super__Head_base<3UL,_double,_false>._M_head_impl;
        local_1c8._24_8_ =
             *(undefined8 *)
              &((local_148._M_impl.super__Deque_impl_data._M_start._M_cur)->
               super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
               super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
               super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
               super__Head_base<2UL,_int,_false>;
        local_1a8._M_head_impl =
             ((local_148._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
             super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
             super__Head_base<1UL,_double,_false>._M_head_impl;
        _Stack_1a0._M_head_impl =
             ((local_148._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
             super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
        if ((_Elt_pointer)local_1c8._8_8_ ==
            (_Elt_pointer)
            ((long)local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3)) {
          if (local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_248,
                       (iterator)
                       local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&_Stack_1a0._M_head_impl);
          }
          else {
            *local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = _Stack_1a0._M_head_impl;
            local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          if (local_148._M_impl.super__Deque_impl_data._M_start._M_cur ==
              local_148._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
            operator_delete(local_148._M_impl.super__Deque_impl_data._M_start._M_first,0x1e0);
            local_148._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_148._M_impl.super__Deque_impl_data._M_start._M_node[1];
            local_148._M_impl.super__Deque_impl_data._M_start._M_last =
                 local_148._M_impl.super__Deque_impl_data._M_start._M_cur + 10;
            local_148._M_impl.super__Deque_impl_data._M_start._M_first =
                 local_148._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_148._M_impl.super__Deque_impl_data._M_start._M_node =
                 local_148._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          }
          else {
            local_148._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_148._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
          }
          dVar22 = (double)local_258 + (double)local_1c8._0_8_;
          local_158 = (_Elt_pointer)(dVar22 - 9.223372036854776e+18);
          dStack_150 = dStack_250;
          local_198 = (_Elt_pointer)GraphBase::inf_eval(graph,&local_248,model,10000);
          iVar16 = (int)_Stack_1a0._M_head_impl;
          uStack_190 = extraout_XMM0_Qb_00;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"UC push new seed: ",0x12);
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          if ((long)local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start == 0) {
            dVar23 = 0.0;
          }
          else {
            lVar15 = (long)local_248.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_248.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3;
            dVar23 = 0.0;
            lVar17 = 0;
            do {
              dVar23 = dVar23 + (local_1d0->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_start
                                [local_248.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar17]];
              lVar17 = lVar17 + 1;
            } while (lVar15 + (ulong)(lVar15 == 0) != lVar17);
          }
          poVar12 = std::ostream::_M_insert<double>(dVar23);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          poVar12 = std::ostream::_M_insert<double>((double)local_198);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          uVar18 = (ulong)dVar22;
          ptVar21 = (_Elt_pointer)((long)(double)local_158 & (long)uVar18 >> 0x3f | uVar18);
        }
        else {
          local_158 = ptVar21;
          if (local_1c8._24_4_ == iVar16) {
            ((local_148._M_impl.super__Deque_impl_data._M_start._M_cur)->
            super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
            super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
            super__Head_base<1UL,_double,_false>._M_head_impl =
                 ((local_148._M_impl.super__Deque_impl_data._M_start._M_cur)->
                 super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
                 super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
                 super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
                 super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
                 super__Head_base<3UL,_double,_false>._M_head_impl;
          }
          else {
            if (local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_248,
                         (iterator)
                         local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&_Stack_1a0._M_head_impl);
            }
            else {
              *local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish = _Stack_1a0._M_head_impl;
              local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            dVar22 = GraphBase::inf_eval(graph,&local_248,model,10000);
            ((local_148._M_impl.super__Deque_impl_data._M_start._M_cur)->
            super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
            super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
            super__Head_base<1UL,_double,_false>._M_head_impl =
                 (dVar22 - (double)local_198) / (double)local_1c8._0_8_;
            iVar1._M_current =
                 local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + -1;
            ((local_148._M_impl.super__Deque_impl_data._M_start._M_cur)->
            super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
            super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
            super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
            super__Head_base<2UL,_int,_false>._M_head_impl = local_274;
            ptVar21 = (_Elt_pointer)(long)local_274;
            local_178 = ptVar21;
            if (iVar1._M_current ==
                local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar1._M_current;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>(&local_248,iVar1,(unsigned_long *)&local_178);
            }
            else {
              local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1] = (unsigned_long)ptVar21;
            }
            if (local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_248,
                         (iterator)
                         local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&_Stack_1a0._M_head_impl);
            }
            else {
              *local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish = _Stack_1a0._M_head_impl;
              local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            dVar22 = GraphBase::inf_eval(graph,&local_248,model,10000);
            ((local_148._M_impl.super__Deque_impl_data._M_start._M_cur)->
            super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
            super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
            super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
            super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
            super__Head_base<3UL,_double,_false>._M_head_impl =
                 (dVar22 - (double)local_198) /
                 ((double)local_1c8._0_8_ +
                 (local_1d0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[(long)ptVar21]);
            local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + -2;
          }
          pptVar11 = local_148._M_impl.super__Deque_impl_data._M_finish._M_node;
          ptVar10 = local_148._M_impl.super__Deque_impl_data._M_finish._M_last;
          ptVar9 = local_148._M_impl.super__Deque_impl_data._M_finish._M_first;
          ptVar8 = local_148._M_impl.super__Deque_impl_data._M_finish._M_cur;
          pptVar7 = local_148._M_impl.super__Deque_impl_data._M_start._M_node;
          ptVar6 = local_148._M_impl.super__Deque_impl_data._M_start._M_last;
          ptVar5 = local_148._M_impl.super__Deque_impl_data._M_start._M_cur;
          if (local_274 == -1) {
            puVar14 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar14 = "cur_best_CB should not be -1";
            __cxa_throw(puVar14,&char_const*::typeinfo,0);
          }
          if ((double)local_260 <
              ((local_148._M_impl.super__Deque_impl_data._M_start._M_cur)->
              super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
              super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
              super__Head_base<1UL,_double,_false>._M_head_impl) {
            local_274 = (int)((local_148._M_impl.super__Deque_impl_data._M_start._M_cur)->
                             super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                             ).super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
          }
          ((local_148._M_impl.super__Deque_impl_data._M_start._M_cur)->
          super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
          super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
          super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
          super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
          super__Tuple_impl<4UL,_unsigned_long,_double>.super__Head_base<4UL,_unsigned_long,_false>.
          _M_head_impl = (long)local_248.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_248.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3;
          ptVar21 = local_158;
          if (local_148._M_impl.super__Deque_impl_data._M_start._M_cur !=
              local_148._M_impl.super__Deque_impl_data._M_finish._M_cur) {
            local_178 = local_148._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_a8 = local_148._M_impl.super__Deque_impl_data._M_start._M_first;
            local_170 = local_148._M_impl.super__Deque_impl_data._M_start._M_first;
            local_168 = local_148._M_impl.super__Deque_impl_data._M_start._M_last;
            local_160 = local_148._M_impl.super__Deque_impl_data._M_start._M_node;
            local_78 = local_148._M_impl.super__Deque_impl_data._M_finish._M_cur;
            local_70 = local_148._M_impl.super__Deque_impl_data._M_finish._M_first;
            local_68 = local_148._M_impl.super__Deque_impl_data._M_finish._M_last;
            local_60 = local_148._M_impl.super__Deque_impl_data._M_finish._M_node;
            uVar18 = ((long)local_148._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_148._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) *
                     -0x5555555555555555 +
                     ((long)local_148._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_148._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) *
                     -0x5555555555555555 +
                     (((long)local_148._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_148._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                     (ulong)(local_148._M_impl.super__Deque_impl_data._M_finish._M_node ==
                            (_Map_pointer)0x0)) * 10;
            lVar15 = 0x3f;
            if (uVar18 != 0) {
              for (; uVar18 >> lVar15 == 0; lVar15 = lVar15 + -1) {
              }
            }
            std::
            __introsort_loop<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,long,__gnu_cxx::__ops::_Iter_comp_iter<CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_4_>>
                      (&local_178,&local_78,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
            local_98 = ptVar5;
            local_90 = local_a8;
            local_88 = ptVar6;
            local_80 = pptVar7;
            local_58 = ptVar8;
            local_50 = ptVar9;
            local_48 = ptVar10;
            local_40 = pptVar11;
            std::
            __final_insertion_sort<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,__gnu_cxx::__ops::_Iter_comp_iter<CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_4_>>
                      (&local_98,&local_58);
            ptVar21 = local_158;
          }
        }
        auVar25._8_4_ = (int)((ulong)ptVar21 >> 0x20);
        auVar25._0_8_ = ptVar21;
        auVar25._12_4_ = 0x45300000;
        dStack_250 = auVar25._8_8_ - 1.9342813113834067e+25;
        local_258 = (_Elt_pointer)
                    (dStack_250 + ((double)CONCAT44(0x43300000,(int)ptVar21) - 4503599627370496.0));
        if (local_180 <= (double)local_258) goto LAB_0011c5b1;
      }
      if (local_148._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_148._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_148._M_impl.super__Deque_impl_data._M_start._M_first,0x1e0);
        local_148._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_148._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_148._M_impl.super__Deque_impl_data._M_start._M_last =
             local_148._M_impl.super__Deque_impl_data._M_start._M_cur + 10;
        local_148._M_impl.super__Deque_impl_data._M_start._M_first =
             local_148._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_148._M_impl.super__Deque_impl_data._M_start._M_node =
             local_148._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_148._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_148._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
    } while (local_148._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_148._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
LAB_0011c5b1:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"End CB",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  if ((double)local_198 <= (double)local_1e8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"UC_inf: ",8);
    poVar12 = std::ostream::_M_insert<double>((double)local_1e8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pvVar13 = &local_228;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CB_inf: ",8);
    poVar12 = std::ostream::_M_insert<double>((double)local_198);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pvVar13 = &local_248;
  }
  puVar4 = (pvVar13->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (local_a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start =
       (pvVar13->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (local_a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = puVar4;
  (local_a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pvVar13->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (pvVar13->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar13->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar13->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_208 != (unsigned_long *)0x0) {
    operator_delete(local_208,(long)local_1f8 - (long)local_208);
  }
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  ::~_Deque_base(&local_148);
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  ::~_Deque_base(&local_f8);
  if (local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_248.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_a0;
}

Assistant:

static std::vector<size_t> celfppalgo (const Graph & graph, const double budget,
            const std::vector<double> & budget_list, const CascadeModel model) {
        std::vector<size_t> S_UC;
        std::vector<size_t> S_CB;
        // u u.mg1 u.prev_best u.mg2 u.flag u.cost
        std::deque<std::tuple<size_t, double, int, double, size_t, double>> Q_UC;
        // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
        std::deque<std::tuple<size_t, double, int, double, size_t, double>> Q_CB;

        int last_seed = -1;
        int cur_best_UC = -1;
        double cur_best_UC_mg1 = 0;
        int cur_best_CB = -1;
        double cur_best_CB_mg1 = 0;
        double mg1_UC = 0;
        double mg1_CB = 0;
        double mg2_UC = 0;
        double mg2_CB = 0;
        std::cout << "Initial deque start" << std::endl;
        std::vector<size_t> vecSeed;
        for (size_t i = 0; i < graph.size(); i++) {
            vecSeed.push_back(i);

            // initial UC
            mg1_UC = GraphBase::inf_eval(graph, vecSeed, model);
            for (size_t j = 0; j < vecSeed.size(); j++) {
                std::cout << vecSeed[j] << " ";
            }
            std::cout << std::endl;
            if (cur_best_UC != -1) {
                vecSeed.push_back(cur_best_UC);
                mg2_UC = GraphBase::inf_eval(graph, vecSeed, model);
                for (size_t j = 0; j < vecSeed.size(); j++) {
                    std::cout << vecSeed[j] << " ";
                }
                std::cout << std::endl;
                vecSeed.pop_back();
            }
            else {
                mg2_UC = mg1_UC;
            }
            // u u.mg1 u.prev_best u.mg2 u.flag u.cost
            Q_UC.push_back(std::make_tuple(i, mg1_UC, cur_best_UC, mg2_UC, 0, budget_list[i]));
            if (cur_best_UC == -1) {
                cur_best_UC = i;
                cur_best_UC_mg1 = mg1_UC;
            }
            else {
                if(cur_best_UC_mg1 < mg1_UC) {
                    cur_best_UC = i;
                    cur_best_UC_mg1 = mg1_UC;
                }
            }

            // initial CB
            mg1_CB = mg1_UC / budget_list[i];
            if (cur_best_CB != -1) {
                vecSeed.push_back(cur_best_CB);
                mg2_CB = GraphBase::inf_eval(graph, vecSeed, model) / (budget_list[i] + budget_list[cur_best_CB]);
                for (size_t j = 0; j < vecSeed.size(); j++) {
                    std::cout << vecSeed[j] << " ";
                }
                std::cout << std::endl;
                vecSeed.pop_back();
            }
            else {
                mg2_CB = mg1_CB;
            }

            // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
            Q_CB.push_back(std::make_tuple(i, mg1_CB, cur_best_CB, mg2_CB, 0, budget_list[i]));
            if (cur_best_CB == -1) {
                cur_best_CB = i;
                cur_best_CB_mg1 = mg1_CB;
            }
            else {
                if (cur_best_CB_mg1 < mg1_CB) {
                    cur_best_CB = i;
                    cur_best_CB_mg1 = mg1_CB;
                }
            }
            vecSeed.pop_back();
        }
        std::cout << "Initial deque end" << std::endl;

        // u u.mg1 u.prev_best u.mg2 u.flag u.cost
        std::sort(Q_UC.begin(), Q_UC.end(), [](auto & left, auto & right) {
            if (std::get<1>(left) == std::get<1>(right)) {
                return std::get<5>(left) < std::get<5>(right);
            }
            else {
                return std::get<1>(left) > std::get<1>(right);
            }
        });

        // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
        std::sort(Q_CB.begin(), Q_CB.end(), [](auto & left, auto & right) {
            if (std::get<1>(left) == std::get<1>(right)) {
                return std::get<5>(left) < std::get<5>(right);
            }
            else {
                return std::get<1>(left) > std::get<1>(right);
            }
        });

        // u u.mg1 u.prev_best u.mg2 u.flag u.cost
        std::cout << "Start UC" << std::endl;
        size_t budget_UC = 0;
        double S_UC_inf = 0;
        while (budget_UC < budget) {
            while (std::get<5>(Q_UC.front()) + budget_UC > budget) {
                Q_UC.pop_front();
                if (Q_UC.empty()) {
                    break;
                }
            }
            if (Q_UC.empty()) {
                break;
            }
            // u u.mg1 u.prev_best u.mg2 u.flag u.cost
            std::tuple<size_t, double, int, double, size_t, double> u = Q_UC.front();
            if (std::get<4>(u) == S_UC.size()) {
                S_UC.push_back(std::get<0>(u));
                Q_UC.pop_front();
                budget_UC = budget_UC + std::get<5>(u);
                S_UC_inf = GraphBase::inf_eval(graph, S_UC, model);
                last_seed = std::get<0>(u);
                std::cout << "UC push new seed: " << std::get<0>(u) << " " << S_UC.size() << " " <<
                          sum_budget(budget_list, S_UC) << " " << S_UC_inf << std::endl;
                continue;
            }
            else if (std::get<2>(u) == last_seed) {
                std::get<1>(Q_UC.front()) = std::get<3>(Q_UC.front());   // u u.mg1 u.prev_best u.mg2 u.flag u.cost
                std::cout << "last seed" << std::endl;
            }
            else {
                S_UC.push_back(std::get<0>(u));
                std::get<1>(Q_UC.front()) = GraphBase::inf_eval(graph, S_UC, model) - S_UC_inf;
                S_UC.pop_back();
                std::get<2>(Q_UC.front()) = cur_best_UC;
                S_UC.push_back(cur_best_UC);
                S_UC.push_back(std::get<0>(u));
                std::get<3>(Q_UC.front()) = GraphBase::inf_eval(graph, S_UC, model) - S_UC_inf;
                S_UC.pop_back();
                S_UC.pop_back();
            }

            if (cur_best_UC != -1){
                if (cur_best_UC_mg1 < std::get<1>(Q_UC.front())) {
                    cur_best_UC = std::get<0>(Q_UC.front());
                }
            }
            else {
                throw "cur_best_UC should not be -1";
            }

            std::get<4>(Q_UC.front()) = S_UC.size();
            std::sort(Q_UC.begin(), Q_UC.end(), [](auto & left, auto & right) {
                if (std::get<1>(left) == std::get<1>(right)) {
                    return std::get<5>(left) < std::get<5>(right);
                }
                else {
                    return std::get<1>(left) > std::get<1>(right);
                }
            });
        }
        std::cout << "End UC" << std::endl;

        // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
        std::cout << "Start CB" << std::endl;
        size_t budget_CB = 0;
        double S_CB_inf = 0;
        while (budget_CB < budget) {
            while (std::get<5>(Q_CB.front()) + budget_CB > budget) {
                Q_CB.pop_front();
                if (Q_CB.empty()) {
                    break;
                }
            }
            if (Q_CB.empty()) {
                break;
            }
            // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
            std::tuple<size_t, double, int, double, size_t, double> u = Q_CB.front();
            if (std::get<4>(u) == S_CB.size()) {
                S_CB.push_back(std::get<0>(u));
                Q_CB.pop_front();
                budget_CB = budget_CB + std::get<5>(u);
                S_CB_inf = GraphBase::inf_eval(graph, S_CB, model);
                last_seed = std::get<0>(u);
                std::cout << "UC push new seed: " << std::get<0>(u) << " " << S_CB.size() << " " <<
                          sum_budget(budget_list, S_CB) << " " << S_CB_inf << std::endl;
                continue;
            }
            else if (std::get<2>(u) == last_seed) {
                // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
                std::get<1>(Q_CB.front()) = std::get<3>(Q_CB.front());
            }
            else {
                S_CB.push_back(std::get<0>(u));
                std::get<1>(Q_CB.front()) = (GraphBase::inf_eval(graph, S_CB, model) - S_CB_inf) / std::get<5>(u);
                S_CB.pop_back();
                std::get<2>(Q_CB.front()) = cur_best_CB;
                S_CB.push_back(cur_best_CB);
                S_CB.push_back(std::get<0>(u));
                std::get<3>(Q_CB.front()) = (GraphBase::inf_eval(graph, S_CB, model) - S_CB_inf) /
                        (std::get<5>(u) + budget_list[cur_best_CB]);
                S_CB.pop_back();
                S_CB.pop_back();
            }
            if (cur_best_CB != -1){
                if(cur_best_CB_mg1 < std::get<1>(Q_CB.front())){
                    cur_best_CB = std::get<0>(Q_CB.front());
                }
            }
            else {
                throw "cur_best_CB should not be -1";
            }
            std::get<4>(Q_CB.front()) = S_CB.size();
            std::sort(Q_CB.begin(), Q_CB.end(), [](auto & left, auto & right) {
                if (std::get<1>(left) == std::get<1>(right)) {
                    return std::get<5>(left) < std::get<5>(right);
                }
                else {
                    return std::get<1>(left) > std::get<1>(right);
                }
            });
        }
        std::cout << "End CB" << std::endl;

        if (S_CB_inf > S_UC_inf) {
            std::cout << "CB_inf: " << S_CB_inf << std::endl;
            return S_CB;
        }
        else {
            std::cout << "UC_inf: " << S_UC_inf << std::endl;
            return S_UC;
        }
    }